

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int binsertch(bstring b,int pos,int len,uchar fill)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = -1;
  if ((((b != (bstring)0x0 && -1 < pos) && (iVar1 = b->slen, -1 < iVar1)) && (iVar1 <= b->mlen)) &&
     (-1 < len && 0 < b->mlen)) {
    iVar4 = len + pos;
    if (iVar1 < pos) {
      iVar1 = balloc(b,iVar4 + 1);
      if (iVar1 != 0) {
        return -1;
      }
      pos = b->slen;
      iVar5 = iVar4;
    }
    else {
      iVar5 = len + iVar1;
      iVar2 = balloc(b,iVar5 + 1);
      if (iVar2 != 0) {
        return -1;
      }
      if (pos < iVar1) {
        lVar3 = (long)iVar5;
        do {
          b->data[lVar3 + -1] = b->data[(lVar3 + -1) - (ulong)(uint)len];
          lVar3 = lVar3 + -1;
        } while (iVar4 < lVar3);
      }
    }
    b->slen = iVar5;
    if (pos < iVar4) {
      lVar3 = (long)pos;
      do {
        b->data[lVar3] = fill;
        lVar3 = lVar3 + 1;
      } while (iVar4 != lVar3);
    }
    b->data[b->slen] = '\0';
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int binsertch (bstring b, int pos, int len, unsigned char fill) {
int d, l, i;

	if (pos < 0 || b == NULL || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || len < 0) return BSTR_ERR;

	/* Compute the two possible end pointers */
	d = b->slen + len;
	l = pos + len;
	if ((d|l) < 0) return BSTR_ERR;

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b, l + 1) != BSTR_OK) return BSTR_ERR;
		pos = b->slen;
		b->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b, d + 1) != BSTR_OK) return BSTR_ERR;
		for (i = d - 1; i >= l; i--) {
			b->data[i] = b->data[i - len];
		}
		b->slen = d;
	}

	for (i=pos; i < l; i++) b->data[i] = fill;
	b->data[b->slen] = (unsigned char) '\0';
	return 0;
}